

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addUnknownChunks(ucvector *out,uchar *data,size_t datasize)

{
  uint uVar1;
  uint *chunk;
  uchar *inchunk;
  
  if (datasize != 0) {
    chunk = (uint *)data;
    do {
      uVar1 = lodepng_chunk_append(&out->data,&out->size,(uchar *)chunk);
      if (uVar1 != 0) {
        return uVar1;
      }
      out->allocsize = out->size;
      uVar1 = *chunk;
      chunk = (uint *)((long)chunk +
                      (ulong)((uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                              uVar1 << 0x18) + 0xc));
    } while ((ulong)((long)chunk - (long)data) < datasize);
  }
  return 0;
}

Assistant:

static unsigned addUnknownChunks(ucvector* out, unsigned char* data, size_t datasize)
{
  unsigned char* inchunk = data;
  while((size_t)(inchunk - data) < datasize)
  {
    CERROR_TRY_RETURN(lodepng_chunk_append(&out->data, &out->size, inchunk));
    out->allocsize = out->size; /*fix the allocsize again*/
    inchunk = lodepng_chunk_next(inchunk);
  }
  return 0;
}